

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

char * alcboolString(ALCboolean x)

{
  char *pcStack_10;
  ALCboolean x_local;
  
  if (x == '\0') {
    pcStack_10 = "ALC_FALSE";
  }
  else if (x == '\x01') {
    pcStack_10 = "ALC_TRUE";
  }
  else {
    pcStack_10 = sprintf_alloc("0x%X",(ulong)(uint)(int)x);
  }
  return pcStack_10;
}

Assistant:

const char *alcboolString(const ALCboolean x)
{
    switch (x) {
        case ALC_TRUE: return "ALC_TRUE";
        case ALC_FALSE: return "ALC_FALSE";
        default: break;
    }

    return sprintf_alloc("0x%X", (uint) x);
}